

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateDocumentInternal(xmlParserCtxtPtr ctxt,xmlValidCtxtPtr vctxt,xmlDocPtr doc)

{
  _xmlDtd *p_Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  xmlChar *in_RAX;
  xmlParserInputPtr input;
  xmlDtdPtr pxVar6;
  xmlNodePtr root;
  xmlParserErrors code;
  char *msg;
  xmlChar *str1;
  xmlChar *sysID;
  
  uVar4 = 0;
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  p_Var1 = doc->intSubset;
  sysID = in_RAX;
  if (p_Var1 == (_xmlDtd *)0x0) {
    if (doc->extSubset != (_xmlDtd *)0x0) goto LAB_0015a1aa;
    code = XML_DTD_NO_DTD;
    str1 = (xmlChar *)0x0;
    msg = "no DTD found!\n";
    goto LAB_0015a265;
  }
  if (p_Var1->SystemID == (xmlChar *)0x0) {
    if ((p_Var1->ExternalID == (xmlChar *)0x0) || (doc->extSubset != (_xmlDtd *)0x0))
    goto LAB_0015a1aa;
    sysID = (xmlChar *)0x0;
LAB_0015a129:
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      pxVar6 = xmlParseDTD(doc->intSubset->ExternalID,sysID);
    }
    else {
      input = xmlLoadResource(ctxt,(char *)sysID,(char *)doc->intSubset->ExternalID,XML_RESOURCE_DTD
                             );
      if (input == (xmlParserInputPtr)0x0) {
        (*xmlFree)(sysID);
        return 0;
      }
      pxVar6 = xmlCtxtParseDtd(ctxt,input,doc->intSubset->ExternalID,sysID);
    }
    doc->extSubset = pxVar6;
    if (sysID != (xmlChar *)0x0) {
      (*xmlFree)(sysID);
      pxVar6 = doc->extSubset;
    }
    if (pxVar6 != (xmlDtdPtr)0x0) {
LAB_0015a1aa:
      if ((xmlHashTablePtr)doc->ids != (xmlHashTablePtr)0x0) {
        xmlHashFree((xmlHashTablePtr)doc->ids,xmlFreeIDTableEntry);
        doc->ids = (void *)0x0;
      }
      if ((xmlHashTablePtr)doc->refs != (xmlHashTablePtr)0x0) {
        xmlHashFree((xmlHashTablePtr)doc->refs,xmlFreeRefTableEntry);
        doc->refs = (void *)0x0;
      }
      uVar3 = xmlValidateDtdFinal(vctxt,doc);
      iVar2 = xmlValidateRoot(vctxt,doc);
      if (iVar2 != 0) {
        root = xmlDocGetRootElement(doc);
        uVar4 = xmlValidateElement(vctxt,doc,root);
        uVar5 = xmlValidateDocumentFinal(vctxt,doc);
        uVar4 = uVar3 & uVar5 & uVar4;
      }
      return uVar4;
    }
    str1 = doc->intSubset->SystemID;
    if (str1 == (xmlChar *)0x0) {
      str1 = doc->intSubset->ExternalID;
    }
    msg = "Could not load the external subset \"%s\"\n";
  }
  else {
    if (doc->extSubset != (_xmlDtd *)0x0) goto LAB_0015a1aa;
    sysID = (xmlChar *)0x0;
    iVar2 = xmlBuildURISafe(p_Var1->SystemID,doc->URL,&sysID);
    if (iVar2 < 0) {
      xmlVErrMemory(vctxt);
      return 0;
    }
    if (iVar2 == 0) goto LAB_0015a129;
    str1 = doc->intSubset->SystemID;
    msg = "Could not build URI for external subset \"%s\"\n";
  }
  code = XML_DTD_LOAD_ERROR;
LAB_0015a265:
  xmlDoErrValid(vctxt,(xmlNodePtr)0x0,code,2,str1,(xmlChar *)0x0,(xmlChar *)0x0,0,msg,str1);
  return 0;
}

Assistant:

static int
xmlValidateDocumentInternal(xmlParserCtxtPtr ctxt, xmlValidCtxtPtr vctxt,
                            xmlDocPtr doc) {
    int ret;
    xmlNodePtr root;

    if (doc == NULL)
        return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        xmlErrValid(vctxt, XML_DTD_NO_DTD,
	            "no DTD found!\n", NULL);
	return(0);
    }

    if ((doc->intSubset != NULL) && ((doc->intSubset->SystemID != NULL) ||
	(doc->intSubset->ExternalID != NULL)) && (doc->extSubset == NULL)) {
	xmlChar *sysID = NULL;

	if (doc->intSubset->SystemID != NULL) {
            int res;

            res = xmlBuildURISafe(doc->intSubset->SystemID, doc->URL, &sysID);
            if (res < 0) {
                xmlVErrMemory(vctxt);
                return 0;
            } else if (res != 0) {
                xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
			"Could not build URI for external subset \"%s\"\n",
			(const char *) doc->intSubset->SystemID);
		return 0;
	    }
	}

        if (ctxt != NULL) {
            xmlParserInputPtr input;

            input = xmlLoadResource(ctxt, (const char *) sysID,
                    (const char *) doc->intSubset->ExternalID,
                    XML_RESOURCE_DTD);
            if (input == NULL) {
                xmlFree(sysID);
                return 0;
            }

            doc->extSubset = xmlCtxtParseDtd(ctxt, input,
                                             doc->intSubset->ExternalID,
                                             sysID);
        } else {
            doc->extSubset = xmlParseDTD(doc->intSubset->ExternalID, sysID);
        }

	if (sysID != NULL)
	    xmlFree(sysID);
        if (doc->extSubset == NULL) {
	    if (doc->intSubset->SystemID != NULL) {
		xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
		       "Could not load the external subset \"%s\"\n",
		       (const char *) doc->intSubset->SystemID);
	    } else {
		xmlErrValid(vctxt, XML_DTD_LOAD_ERROR,
		       "Could not load the external subset \"%s\"\n",
		       (const char *) doc->intSubset->ExternalID);
	    }
	    return(0);
	}
    }

    if (doc->ids != NULL) {
          xmlFreeIDTable(doc->ids);
          doc->ids = NULL;
    }
    if (doc->refs != NULL) {
          xmlFreeRefTable(doc->refs);
          doc->refs = NULL;
    }
    ret = xmlValidateDtdFinal(vctxt, doc);
    if (!xmlValidateRoot(vctxt, doc)) return(0);

    root = xmlDocGetRootElement(doc);
    ret &= xmlValidateElement(vctxt, doc, root);
    ret &= xmlValidateDocumentFinal(vctxt, doc);
    return(ret);
}